

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederate.cpp
# Opt level: O0

void helics::
     loadOptions<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,helics::Input>
               (ValueFederate *fed,
               basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
               *data,Input *objUpdate)

{
  string_view info_00;
  string_view defVal;
  anon_class_16_2_5e8ce78e callback;
  bool bVar1;
  Input *in_RDX;
  string *in_RSI;
  undefined8 in_RDI;
  string info;
  double tol;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  string *in_stack_fffffffffffffd58;
  Interface *in_stack_fffffffffffffd60;
  Input *pIVar2;
  string *key;
  json *pjVar3;
  allocator<char> *in_stack_fffffffffffffd80;
  allocator<char> *__a;
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *in_stack_fffffffffffffd88;
  string *__s;
  string *in_stack_fffffffffffffd90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_211;
  Input *local_1f0;
  function<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
  local_1e8;
  undefined1 in_stack_fffffffffffffe38 [16];
  Input *in_stack_fffffffffffffe48;
  ValueFederate *in_stack_fffffffffffffe50;
  json local_1a1;
  string *in_stack_fffffffffffffe70;
  json *in_stack_fffffffffffffe78;
  anon_class_8_1_a2318340 in_stack_fffffffffffffe80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_159;
  function<void_(int,_int)> *in_stack_fffffffffffffec8;
  function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *in_stack_fffffffffffffed0;
  function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *in_stack_fffffffffffffed8;
  json *in_stack_fffffffffffffee0;
  allocator<char> local_f9 [33];
  Input *local_d8;
  Input *local_60;
  undefined8 local_58;
  allocator<char> local_39 [33];
  Input *local_18;
  string *local_10;
  undefined8 local_8;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffd90,(char *)in_stack_fffffffffffffd88,in_stack_fffffffffffffd80);
  local_60 = local_18;
  local_58 = local_8;
  callback.fed = in_stack_fffffffffffffe50;
  callback.objUpdate = in_stack_fffffffffffffe48;
  addTargets<helics::loadOptions<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,helics::Input>(helics::ValueFederate*,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>const&,helics::Input&)::_lambda(std::__cxx11::string_const&)_1_>
            (in_stack_fffffffffffffe38._8_8_,in_stack_fffffffffffffe38._0_8_,callback);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffd50);
  std::allocator<char>::~allocator(local_39);
  std::function<int(std::__cxx11::string_const&)>::
  function<helics::loadOptions<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,helics::Input>(helics::ValueFederate*,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>const&,helics::Input&)::_lambda(std::__cxx11::string_const&)_2_,void>
            ((function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)in_stack_fffffffffffffd60,(anon_class_1_0_00000001 *)in_stack_fffffffffffffd58);
  std::function<int(std::__cxx11::string_const&)>::
  function<helics::loadOptions<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,helics::Input>(helics::ValueFederate*,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>const&,helics::Input&)::_lambda(std::__cxx11::string_const&)_3_,void>
            ((function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)in_stack_fffffffffffffd60,(anon_class_1_0_00000001 *)in_stack_fffffffffffffd58);
  local_d8 = local_18;
  std::function<void(int,int)>::
  function<helics::loadOptions<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,helics::Input>(helics::ValueFederate*,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>const&,helics::Input&)::_lambda(int,int)_1_,void>
            ((function<void_(int,_int)> *)in_stack_fffffffffffffd60,
             (anon_class_8_1_a2318340 *)in_stack_fffffffffffffd58);
  processOptions(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,
                 in_stack_fffffffffffffec8);
  std::function<void_(int,_int)>::~function((function<void_(int,_int)> *)0x2cb8fc);
  std::
  function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function((function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
               *)0x2cb909);
  std::
  function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function((function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
               *)0x2cb916);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffd90,(char *)in_stack_fffffffffffffd88,in_stack_fffffffffffffd80);
  pjVar3 = (json *)&stack0xfffffffffffffee0;
  std::function<void(std::__cxx11::string_const&)>::
  function<helics::loadOptions<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,helics::Input>(helics::ValueFederate*,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>const&,helics::Input&)::_lambda(std::basic_string_view<char,std::char_traits<char>>)_1_,void>
            ((function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)in_stack_fffffffffffffd60,(anon_class_16_2_5e8ce78e *)in_stack_fffffffffffffd58);
  fileops::callIfMember(pjVar3,in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function((function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
               *)0x2cb9b0);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffd50);
  std::allocator<char>::~allocator(local_f9);
  this_00 = &local_159;
  __s = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_00,(char *)__s,in_stack_fffffffffffffd80);
  __a = (allocator<char> *)
        fileops::getOrDefault
                  ((json *)in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,
                   (double)in_stack_fffffffffffffd50);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffd50);
  std::allocator<char>::~allocator((allocator<char> *)&local_159);
  if (0.0 < (double)__a) {
    Input::setMinimumChange(local_18,(double)__a);
  }
  pjVar3 = &local_1a1;
  key = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_00,(char *)__s,__a);
  defVal._M_str = (char *)__s;
  defVal._M_len = (size_t)__a;
  fileops::getOrDefault(pjVar3,key,defVal);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffd50);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a1);
  bVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2cbc40);
  if (!bVar1) {
    pIVar2 = local_18;
    std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffd50);
    info_00._M_str = (char *)key;
    info_00._M_len = (size_t)pIVar2;
    Interface::setInfo(in_stack_fffffffffffffd60,info_00);
  }
  local_1f0 = local_18;
  std::
  function<void(std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>)>
  ::
  function<helics::loadOptions<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,helics::Input>(helics::ValueFederate*,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>const&,helics::Input&)::_lambda(std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>)_1_,void>
            (&local_1e8,(anon_class_8_1_a2318340 *)local_10);
  loadTags((json *)info.field_2._8_8_,
           (function<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
            *)info.field_2._M_allocated_capacity);
  CLI::std::
  function<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
  ::~function((function<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
               *)0x2cbd47);
  this = &local_211;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_00,(char *)__s,__a);
  addTargets<helics::loadOptions<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,helics::Input>(helics::ValueFederate*,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>const&,helics::Input&)::_lambda(std::basic_string_view<char,std::char_traits<char>>)_2_>
            (in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,in_stack_fffffffffffffe80);
  std::__cxx11::string::~string(this);
  std::allocator<char>::~allocator((allocator<char> *)&local_211);
  std::__cxx11::string::~string(this);
  return;
}

Assistant:

static void loadOptions(ValueFederate* fed, const Inp& data, Obj& objUpdate)
{
    using fileops::getOrDefault;

    addTargets(data, "flags", [&objUpdate, fed](const std::string& target) {
        auto oindex = getOptionIndex((target.front() != '-') ? target : target.substr(1));
        const int val = (target.front() != '-') ? 1 : 0;
        if (oindex == HELICS_INVALID_OPTION_INDEX) {
            fed->logWarningMessage(target + " is not a valid flag");
            return;
        }
        objUpdate.setOption(oindex, val);
    });
    processOptions(
        data,
        [](const std::string& option) { return getOptionIndex(option); },
        [](const std::string& value) { return getOptionValue(value); },
        [&objUpdate](int32_t option, int32_t value) { objUpdate.setOption(option, value); });

    fileops::callIfMember(data, "alias", [&objUpdate, fed](std::string_view val) {
        fed->addAlias(objUpdate, val);
    });

    auto tol = getOrDefault(data, "tolerance", -1.0);
    if (tol > 0.0) {
        objUpdate.setMinimumChange(tol);
    }
    auto info = getOrDefault(data, "info", emptyStr);
    if (!info.empty()) {
        objUpdate.setInfo(info);
    }
    loadTags(data, [&objUpdate](std::string_view tagname, std::string_view tagvalue) {
        objUpdate.setTag(tagname, tagvalue);
    });
    addTargets(data, "targets", [&objUpdate](std::string_view target) {
        objUpdate.addTarget(target);
    });
}